

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O2

void deqp::gles31::Functional::anon_unknown_0::generateReferencedByShaderCaseBlocks
               (Context *context,TestCaseGroup *targetGroup,GLSLVersion glslVersion,
               _func_void_Context_ptr_SharedPtr_ptr_TestCaseGroup_ptr_int *generateBlockContent)

{
  ShaderType type;
  deUint32 stagesPresentBits;
  char *name;
  TestCaseGroup *pTVar1;
  Program *pPVar2;
  Shader *this;
  ShaderSet *pSVar3;
  char *__rhs;
  long lVar4;
  uint uVar5;
  undefined8 *puVar6;
  SharedPtr program;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  SharedPtr stage;
  SharedPtr program_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  for (lVar4 = 0xc; lVar4 != 0x6c; lVar4 = lVar4 + 0x10) {
    pTVar1 = (TestCaseGroup *)operator_new(0x78);
    TestCaseGroup::TestCaseGroup
              (pTVar1,context,
               *(char **)((long)&generateUniformMatrixStrideCaseBlockContentCases::qualifiers[2].
                                 name + lVar4 + 4),glcts::fixed_sample_locations_values + 1);
    type = *(ShaderType *)
            (&generateUniformMatrixStrideCaseBlockContentCases::qualifiers[2].field_0xc + lVar4);
    pPVar2 = (Program *)operator_new(0x28);
    ResourceDefinition::Program::Program(pPVar2,type != SHADERTYPE_COMPUTE);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&program,(Node *)pPVar2);
    this = (Shader *)operator_new(0x28);
    ResourceDefinition::Shader::Shader(this,&program,type,glslVersion);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&stage,(Node *)this);
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pTVar1);
    (*generateBlockContent)
              (context,&stage,(TestCaseGroup *)pTVar1,
               *(int *)((long)&generateReferencedByShaderCaseBlocks::singleStageCases[0].name +
                       lVar4));
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&stage);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&program);
  }
  for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
    pTVar1 = (TestCaseGroup *)operator_new(0x78);
    name = generateReferencedByShaderCaseBlocks::pipelines[lVar4].name;
    TestCaseGroup::TestCaseGroup(pTVar1,context,name,glcts::fixed_sample_locations_values + 1);
    pPVar2 = (Program *)operator_new(0x28);
    ResourceDefinition::Program::Program(pPVar2,false);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&program,(Node *)pPVar2);
    pSVar3 = (ShaderSet *)operator_new(0x30);
    stagesPresentBits = generateReferencedByShaderCaseBlocks::pipelines[lVar4].flags;
    ResourceDefinition::ShaderSet::ShaderSet
              (pSVar3,&program,glslVersion,stagesPresentBits,stagesPresentBits);
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pTVar1);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&stage,(Node *)pSVar3);
    (*generateBlockContent)
              (context,&stage,(TestCaseGroup *)pTVar1,
               generateReferencedByShaderCaseBlocks::pipelines[lVar4].expandLevel);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&stage);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&program);
    puVar6 = &DAT_01e544b0;
    for (uVar5 = 0; uVar5 != 6; uVar5 = uVar5 + 1) {
      if ((stagesPresentBits >> (uVar5 & 0x1f) & 1) != 0) {
        pPVar2 = (Program *)operator_new(0x28);
        ResourceDefinition::Program::Program(pPVar2,false);
        de::
        SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
        SharedPtr(&program_2,(Node *)pPVar2);
        pSVar3 = (ShaderSet *)operator_new(0x30);
        ResourceDefinition::ShaderSet::ShaderSet
                  (pSVar3,&program_2,glslVersion,stagesPresentBits,1 << ((byte)uVar5 & 0x1f));
        if (uVar5 < 4) {
          __rhs = (char *)*puVar6;
        }
        else {
          __rhs = (char *)0x0;
          if (uVar5 == 4) {
            __rhs = "tess_eval";
          }
        }
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        local_a0._M_string_length = 0;
        local_a0.field_2._M_local_buf[0] = '\0';
        std::operator+(&local_50,&local_a0,name);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stage,
                       &local_50,"_only_");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&program
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stage,
                       __rhs);
        std::__cxx11::string::~string((string *)&stage);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_a0);
        pTVar1 = (TestCaseGroup *)operator_new(0x78);
        TestCaseGroup::TestCaseGroup
                  (pTVar1,context,(char *)program.m_ptr,glcts::fixed_sample_locations_values + 1);
        de::
        SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
        SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                   *)&stage,(Node *)pSVar3);
        (*generateBlockContent)
                  (context,&stage,(TestCaseGroup *)pTVar1,
                   generateReferencedByShaderCaseBlocks::pipelines[lVar4].subExpandLevel);
        tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pTVar1);
        de::
        SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
        ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                    *)&stage);
        std::__cxx11::string::~string((string *)&program);
        de::
        SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
        ~SharedPtr(&program_2);
      }
      puVar6 = puVar6 + 1;
    }
  }
  return;
}

Assistant:

static void generateReferencedByShaderCaseBlocks (Context& context, tcu::TestCaseGroup* const targetGroup, glu::GLSLVersion glslVersion, void (*generateBlockContent)(Context&, const ResourceDefinition::Node::SharedPtr&, tcu::TestCaseGroup*, int expandLevel))
{
	static const struct
	{
		const char*		name;
		glu::ShaderType	stage;
		int				expandLevel;
	} singleStageCases[] =
	{
		{ "compute",				glu::SHADERTYPE_COMPUTE,					3	},
		{ "separable_vertex",		glu::SHADERTYPE_VERTEX,						2	},
		{ "separable_fragment",		glu::SHADERTYPE_FRAGMENT,					2	},
		{ "separable_tess_ctrl",	glu::SHADERTYPE_TESSELLATION_CONTROL,		2	},
		{ "separable_tess_eval",	glu::SHADERTYPE_TESSELLATION_EVALUATION,	2	},
		{ "separable_geometry",		glu::SHADERTYPE_GEOMETRY,					2	},
	};
	static const struct
	{
		const char*	name;
		deUint32	flags;
		int			expandLevel;
		int			subExpandLevel;
	} pipelines[] =
	{
		{
			"vertex_fragment",
			(1 << glu::SHADERTYPE_VERTEX) | (1 << glu::SHADERTYPE_FRAGMENT),
			3,
			2,
		},
		{
			"vertex_tess_fragment",
			(1 << glu::SHADERTYPE_VERTEX) | (1 << glu::SHADERTYPE_FRAGMENT) | (1 << glu::SHADERTYPE_TESSELLATION_CONTROL) | (1 << glu::SHADERTYPE_TESSELLATION_EVALUATION),
			2,
			2,
		},
		{
			"vertex_geo_fragment",
			(1 << glu::SHADERTYPE_VERTEX) | (1 << glu::SHADERTYPE_FRAGMENT) | (1 << glu::SHADERTYPE_GEOMETRY),
			2,
			2,
		},
		{
			"vertex_tess_geo_fragment",
			(1 << glu::SHADERTYPE_VERTEX) | (1 << glu::SHADERTYPE_FRAGMENT) | (1 << glu::SHADERTYPE_TESSELLATION_CONTROL) | (1 << glu::SHADERTYPE_TESSELLATION_EVALUATION) | (1 << glu::SHADERTYPE_GEOMETRY),
			2,
			1,
		},
	};

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(singleStageCases); ++ndx)
	{
		TestCaseGroup* const						blockGroup			= new TestCaseGroup(context, singleStageCases[ndx].name, "");
		const bool									programSeparable	= (singleStageCases[ndx].stage != glu::SHADERTYPE_COMPUTE);
		const ResourceDefinition::Node::SharedPtr	program				(new ResourceDefinition::Program(programSeparable));
		const ResourceDefinition::Node::SharedPtr	stage				(new ResourceDefinition::Shader(program, singleStageCases[ndx].stage, glslVersion));

		targetGroup->addChild(blockGroup);

		generateBlockContent(context, stage, blockGroup, singleStageCases[ndx].expandLevel);
	}

	for (int pipelineNdx = 0; pipelineNdx < DE_LENGTH_OF_ARRAY(pipelines); ++pipelineNdx)
	{
		// whole pipeline
		{
			TestCaseGroup* const						blockGroup			= new TestCaseGroup(context, pipelines[pipelineNdx].name, "");
			const ResourceDefinition::Node::SharedPtr	program				(new ResourceDefinition::Program());
			ResourceDefinition::ShaderSet*				shaderSet			= new ResourceDefinition::ShaderSet(program,
																												glslVersion,
																												pipelines[pipelineNdx].flags,
																												pipelines[pipelineNdx].flags);
			targetGroup->addChild(blockGroup);

			{
				const ResourceDefinition::Node::SharedPtr shaders(shaderSet);
				generateBlockContent(context, shaders, blockGroup, pipelines[pipelineNdx].expandLevel);
			}
		}

		// only one stage
		for (int selectedStageBit = 0; selectedStageBit < glu::SHADERTYPE_LAST; ++selectedStageBit)
		{
			if (pipelines[pipelineNdx].flags & (1 << selectedStageBit))
			{
				const ResourceDefinition::Node::SharedPtr	program		(new ResourceDefinition::Program());
				ResourceDefinition::ShaderSet*				shaderSet	= new ResourceDefinition::ShaderSet(program,
																											glslVersion,
																											pipelines[pipelineNdx].flags,
																											(1u << selectedStageBit));
				const char*									stageName	= (selectedStageBit == glu::SHADERTYPE_VERTEX)					? ("vertex")
																		: (selectedStageBit == glu::SHADERTYPE_FRAGMENT)				? ("fragment")
																		: (selectedStageBit == glu::SHADERTYPE_GEOMETRY)				? ("geo")
																		: (selectedStageBit == glu::SHADERTYPE_TESSELLATION_CONTROL)	? ("tess_ctrl")
																		: (selectedStageBit == glu::SHADERTYPE_TESSELLATION_EVALUATION)	? ("tess_eval")
																		: (DE_NULL);
				const std::string							setName		= std::string() + pipelines[pipelineNdx].name + "_only_" + stageName;
				TestCaseGroup* const						blockGroup	= new TestCaseGroup(context, setName.c_str(), "");
				const ResourceDefinition::Node::SharedPtr	shaders		(shaderSet);

				generateBlockContent(context, shaders, blockGroup, pipelines[pipelineNdx].subExpandLevel);
				targetGroup->addChild(blockGroup);
			}
		}
	}
}